

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_extract_iter_free(mz_zip_reader_extract_iter_state *pState)

{
  int iVar1;
  long *in_RDI;
  int status;
  uint local_20;
  
  if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (*(long *)(*in_RDI + 0x68) == 0)) {
    local_20 = 0;
  }
  else {
    if ((*(int *)((long)in_RDI + 0xc) == 0) && ((*(uint *)(in_RDI + 1) & 0x400) == 0)) {
      if (in_RDI[7] == in_RDI[0xf]) {
        if ((int)in_RDI[2] != (int)in_RDI[0xd]) {
          if (*in_RDI != 0) {
            *(undefined4 *)(*in_RDI + 0x1c) = 0xb;
          }
          *(undefined4 *)((long)in_RDI + 0xc) = 0xffffffff;
        }
      }
      else {
        if (*in_RDI != 0) {
          *(undefined4 *)(*in_RDI + 0x1c) = 0xd;
        }
        *(undefined4 *)((long)in_RDI + 0xc) = 0xffffffff;
      }
    }
    if (*(long *)(*(long *)(*in_RDI + 0x68) + 0x80) == 0) {
      (**(code **)(*in_RDI + 0x30))(*(undefined8 *)(*in_RDI + 0x40),in_RDI[0x94]);
    }
    if (in_RDI[0x95] != 0) {
      (**(code **)(*in_RDI + 0x30))(*(undefined8 *)(*in_RDI + 0x40),in_RDI[0x95]);
    }
    iVar1 = *(int *)((long)in_RDI + 0xc);
    (**(code **)(*in_RDI + 0x30))(*(undefined8 *)(*in_RDI + 0x40),in_RDI);
    local_20 = (uint)(iVar1 == 0);
  }
  return local_20;
}

Assistant:

mz_bool
mz_zip_reader_extract_iter_free(mz_zip_reader_extract_iter_state *pState) {
  int status;

  /* Argument sanity check */
  if ((!pState) || (!pState->pZip) || (!pState->pZip->m_pState))
    return MZ_FALSE;

  /* Was decompression completed and requested? */
  if ((pState->status == TINFL_STATUS_DONE) &&
      (!(pState->flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    /* Make sure the entire file was decompressed, and check its CRC. */
    if (pState->out_buf_ofs != pState->file_stat.m_uncomp_size) {
      mz_zip_set_error(pState->pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
      pState->status = TINFL_STATUS_FAILED;
    }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    else if (pState->file_crc32 != pState->file_stat.m_crc32) {
      mz_zip_set_error(pState->pZip, MZ_ZIP_DECOMPRESSION_FAILED);
      pState->status = TINFL_STATUS_FAILED;
    }
#endif
  }

  /* Free buffers */
  if (!pState->pZip->m_pState->m_pMem)
    pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState->pRead_buf);
  if (pState->pWrite_buf)
    pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState->pWrite_buf);

  /* Save status */
  status = pState->status;

  /* Free context */
  pState->pZip->m_pFree(pState->pZip->m_pAlloc_opaque, pState);

  return status == TINFL_STATUS_DONE;
}